

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heterogeneous_queue.hpp
# Opt level: O2

type __thiscall
libtorrent::heterogeneous_queue<libtorrent::alert>::
emplace_back<libtorrent::dht_mutable_item_alert,libtorrent::aux::stack_allocator&,std::array<char,32ul>const&,std::array<char,64ul>const&,long,std::__cxx11::string_const&,libtorrent::entry_const&,bool_const&>
          (heterogeneous_queue<libtorrent::alert> *this,stack_allocator *args,
          array<char,_32UL> *args_1,array<char,_64UL> *args_2,long *args_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4,entry *args_5,
          bool *args_6)

{
  ushort *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  _Head_base<0UL,_char_*,_false> _Var4;
  int64_t sequence;
  char *pcVar5;
  size_t sVar6;
  string_view s;
  long lVar7;
  uint uVar8;
  dht_mutable_item_alert *this_00;
  entry local_58;
  
  lVar7 = (long)this->m_size;
  if ((ulong)(long)this->m_capacity < lVar7 + 0xe0U) {
    grow_capacity(this,0xe0);
    lVar7 = (long)this->m_size;
  }
  _Var4._M_head_impl =
       (this->m_storage)._M_t.super___uniq_ptr_impl<char,_libtorrent::aux::free_deleter>._M_t.
       super__Tuple_impl<0UL,_char_*,_libtorrent::aux::free_deleter>.
       super__Head_base<0UL,_char_*,_false>._M_head_impl;
  puVar1 = (ushort *)(_Var4._M_head_impl + lVar7);
  uVar8 = -(int)puVar1 - 0x10U & 7;
  _Var4._M_head_impl[lVar7 + 2] = (char)uVar8;
  *(code **)(_Var4._M_head_impl + lVar7 + 8) = move<libtorrent::dht_mutable_item_alert>;
  this_00 = (dht_mutable_item_alert *)((long)puVar1 + (ulong)uVar8 + 0x10);
  *(ushort *)(_Var4._M_head_impl + lVar7) = -(short)this_00 - 200U & 7 | 200;
  sequence = *args_3;
  pcVar5 = (args_4->_M_dataplus)._M_p;
  sVar6 = args_4->_M_string_length;
  entry::entry(&local_58,args_5);
  s._M_str = pcVar5;
  s._M_len = sVar6;
  dht_mutable_item_alert::dht_mutable_item_alert
            (this_00,args,args_1,args_2,sequence,s,&local_58,*args_6);
  entry::~entry(&local_58);
  uVar2 = this->m_size;
  uVar3 = this->m_num_items;
  this->m_size = uVar8 + 0x10 + (uint)*puVar1 + uVar2;
  this->m_num_items = uVar3 + 1;
  return this_00;
}

Assistant:

typename std::enable_if<std::is_base_of<T, U>::value, U&>::type
		emplace_back(Args&&... args)
		{
			// make the conservative assumption that we'll need the maximum padding
			// for this object, just for purposes of growing the storage
			if (std::size_t(m_size) + sizeof(header_t) + alignof(U) + sizeof(U) > std::size_t(m_capacity))
				grow_capacity(sizeof(header_t) + alignof(U) + sizeof(U));

			char* ptr = m_storage.get() + m_size;

			std::size_t const pad_bytes = aux::calculate_pad_bytes(ptr + sizeof(header_t), alignof(U));

			// pad_bytes is only 8 bits in the header, so types that need more than
			// 256 byte alignment may not be supported
			static_assert(alignof(U) <= 256
				, "heterogeneous_queue does not support types with alignment requirements > 256");

#ifdef TORRENT_ADDRESS_SANITIZER
			std::size_t const hdr_len = sizeof(U)
				+ aux::calculate_pad_bytes(ptr + sizeof(header_t) + pad_bytes + sizeof(U)
					, alignof(header_t));

			int const new_size = m_size + int(sizeof(header_t) + pad_bytes + hdr_len);

			__sanitizer_annotate_contiguous_container(
				m_storage.get()
				, m_storage.get() + m_capacity
				, ptr
				, m_storage.get() + new_size);
#endif

			// if this assert triggers, the type being added to the queue has
			// alignment requirements stricter than what malloc() returns. This is
			// not supported
			TORRENT_ASSERT((reinterpret_cast<std::uintptr_t>(m_storage.get())
				& (alignof(U) - 1)) == 0);

			// make sure the current position in the storage is aligned for
			// creating a heder_t object
			TORRENT_ASSERT((reinterpret_cast<std::uintptr_t>(ptr)
				& (alignof(header_t) - 1)) == 0);

			// length prefix
			header_t* hdr = new (ptr) header_t;
			hdr->pad_bytes = static_cast<std::uint8_t>(pad_bytes);
			hdr->move = &move<U>;
			ptr += sizeof(header_t) + pad_bytes;
			hdr->len = static_cast<std::uint16_t>(sizeof(U)
				+ aux::calculate_pad_bytes(ptr + sizeof(U), alignof(header_t)));

			// make sure ptr is correctly aligned for the object we're about to
			// create there
			TORRENT_ASSERT((reinterpret_cast<std::uintptr_t>(ptr)
				& (alignof(U) - 1)) == 0);

			// construct in-place
			U* const ret = new (ptr) U(std::forward<Args>(args)...);

			// if we constructed the object without throwing any exception
			// update counters to indicate the new item is in there
			++m_num_items;
			m_size += int(sizeof(header_t) + pad_bytes + hdr->len);
#ifdef TORRENT_ADDRESS_SANITIZER
			TORRENT_ASSERT(m_size == new_size);
#endif
			return *ret;
		}